

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp-conf.c
# Opt level: O2

int lwsws_get_config_globals(lws_context_creation_info *info,char *d,char **cs,int *len)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char **ppcVar4;
  long lVar5;
  int iVar6;
  char **ppcVar7;
  lws_dir_args da;
  lws_context_creation_info *local_198;
  undefined1 local_190 [32];
  char *local_170;
  char *local_168;
  char **local_c8;
  int local_c0;
  undefined1 local_bc;
  char dd [128];
  
  ppcVar7 = info->plugin_dirs;
  iVar6 = 0;
  memset(local_190,0,0xd8);
  local_170 = *cs;
  local_168 = local_170 + (long)*len + -1;
  uVar3 = (ulong)((uint)local_170 & 0xf);
  lVar5 = 0x10 - uVar3;
  if (uVar3 == 0) {
    lVar5 = 0;
  }
  local_c8 = (char **)(local_170 + lVar5);
  local_bc = 0;
  info->plugin_dirs = local_c8;
  local_170 = local_170 + lVar5 + 0x50;
  ppcVar4 = local_c8;
  for (; (ppcVar7 != (char **)0x0 && (*ppcVar7 != (char *)0x0)); ppcVar7 = ppcVar7 + 1) {
    *ppcVar4 = *ppcVar7;
    iVar6 = iVar6 + 1;
    ppcVar4 = ppcVar4 + 1;
  }
  local_198 = info;
  local_c0 = iVar6;
  lws_snprintf(dd,0x7f,"%s/conf",d);
  uVar1 = lwsws_get_config(&local_198,dd,paths_global,0xf,lejp_globals_cb);
  iVar6 = 1;
  if (uVar1 < 2) {
    lws_snprintf(dd,0x7f,"%s/conf.d",d);
    da.paths = paths_global;
    da.count_paths = 0xf;
    da.cb = lejp_globals_cb;
    da.user = &local_198;
    iVar2 = lws_dir(dd,&da,lwsws_get_config_d_cb);
    if (iVar2 < 2) {
      local_c8[local_c0] = (char *)0x0;
      *cs = local_170;
      *len = (int)local_168 - (int)local_170;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int
lwsws_get_config_globals(struct lws_context_creation_info *info, const char *d,
			 char **cs, int *len)
{
	struct lws_dir_args da;
	struct jpargs a;
	const char * const *old = info->plugin_dirs;
	char dd[128];

	memset(&a, 0, sizeof(a));

	a.info = info;
	a.p = *cs;
	a.end = (a.p + *len) - 1;
	a.valid = 0;

	lwsws_align(&a);
	info->plugin_dirs = (void *)a.p;
	a.plugin_dirs = (void *)a.p; /* writeable version */
	a.p += MAX_PLUGIN_DIRS * sizeof(void *);

	/* copy any default paths */

	while (old && *old) {
		a.plugin_dirs[a.count_plugin_dirs++] = *old;
		old++;
	}

	lws_snprintf(dd, sizeof(dd) - 1, "%s/conf", d);
	if (lwsws_get_config(&a, dd, paths_global,
			     LWS_ARRAY_SIZE(paths_global), lejp_globals_cb) > 1)
		return 1;
	lws_snprintf(dd, sizeof(dd) - 1, "%s/conf.d", d);

	da.user = &a;
	da.paths = paths_global;
	da.count_paths = LWS_ARRAY_SIZE(paths_global),
	da.cb = lejp_globals_cb;

	if (lws_dir(dd, &da, lwsws_get_config_d_cb) > 1)
		return 1;

	a.plugin_dirs[a.count_plugin_dirs] = NULL;

	*cs = a.p;
	*len = lws_ptr_diff(a.end, a.p);

	return 0;
}